

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var __thiscall cs::runtime_type::parse_choice(runtime_type *this,var *a,iterator *b)

{
  bool bVar1;
  type_info *this_00;
  bool *pbVar2;
  runtime_error *this_01;
  iterator *in_RCX;
  allocator local_41;
  string local_40;
  
  this_00 = cs_impl::any::type((any *)b);
  bVar1 = std::type_info::operator==(this_00,(type_info *)&bool::typeinfo);
  if (bVar1) {
    pbVar2 = cs_impl::any::const_val<bool>((any *)b);
    if (*pbVar2 == true) {
      local_40._M_dataplus._M_p = (pointer)tree_type<cs::token_base_*>::iterator::left(in_RCX);
    }
    else {
      local_40._M_dataplus._M_p = (pointer)tree_type<cs::token_base_*>::iterator::right(in_RCX);
    }
    parse_expr(this,(iterator *)a,SUB81(&local_40,0));
    return (var)(proxy *)this;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_40,"Unsupported operator operations(Choice).",&local_41);
  runtime_error::runtime_error(this_01,&local_40);
  __cxa_throw(this_01,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var runtime_type::parse_choice(const var &a, const tree_type<token_base *>::iterator &b)
	{
		if (a.type() == typeid(boolean)) {
			if (a.const_val<boolean>())
				return parse_expr(b.left());
			else
				return parse_expr(b.right());
		}
		else
			throw runtime_error("Unsupported operator operations(Choice).");
	}